

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_>::on_oct
          (int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_> *this)

{
  uint uVar1;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *this_00;
  bin_writer<3> f;
  bool bVar2;
  int num_digits_00;
  string_view prefix;
  undefined4 uStack_2c;
  int num_digits;
  int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_> *this_local;
  
  num_digits_00 =
       basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
       int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::count_digits<3u>
                 ((int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>> *)this);
  bVar2 = core_format_specs::has(&this->spec->super_core_format_specs,8);
  if ((bVar2) && ((this->spec->super_core_format_specs).precision <= num_digits_00)) {
    uVar1 = this->prefix_size;
    this->prefix_size = uVar1 + 1;
    this->prefix[uVar1] = '0';
  }
  this_00 = this->writer;
  prefix = get_prefix(this);
  f._12_4_ = uStack_2c;
  f.num_digits = num_digits_00;
  f.abs_value = this->abs_value;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
  write_int<fmt::v5::basic_format_specs<wchar_t>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *)
             this_00,num_digits_00,prefix,this->spec,f);
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>();
      if (spec.has(HASH_FLAG) &&
          spec.precision <= num_digits) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), spec,
                       bin_writer<3>{abs_value, num_digits});
    }